

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O1

void __thiscall trento::WoodsSaxonNucleus::sample_nucleons_impl(WoodsSaxonNucleus *this)

{
  pointer pdVar1;
  bool bVar2;
  int iVar3;
  double *r;
  pointer pdVar4;
  double *pdVar5;
  const_iterator nucleon;
  result_type_conflict rVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  vector<double,_std::allocator<double>_> radii;
  allocator_type local_69;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             ((long)(this->super_MinDistNucleus).super_Nucleus.nucleons_.
                    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_MinDistNucleus).super_Nucleus.nucleons_.
                    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_69);
  pdVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pdVar4 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      rVar6 = std::piecewise_linear_distribution<double>::operator()
                        (&this->woods_saxon_dist_,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)&random::engine,&(this->woods_saxon_dist_)._M_param);
      *pdVar4 = rVar6;
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar1);
  }
  pdVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar1,local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  nucleon._M_current =
       (this->super_MinDistNucleus).super_Nucleus.nucleons_.
       super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
       super__Vector_impl_data._M_start;
  pdVar5 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (nucleon._M_current !=
      (this->super_MinDistNucleus).super_Nucleus.nucleons_.
      super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar3 = 1000;
      do {
        local_60 = std::
                   generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                             ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                               *)&random::engine);
        local_58 = std::
                   generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                             ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                               *)&random::engine);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_60;
        auVar9 = vfmadd132sd_fma(auVar9,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
        local_58 = local_58 * 6.283185307179586;
        local_68 = *pdVar5;
        local_60 = auVar9._0_8_;
        auVar9 = vfnmadd213sd_fma(auVar9,auVar9,ZEXT816(0x3ff0000000000000));
        if (auVar9._0_8_ < 0.0) {
          dVar7 = sqrt(auVar9._0_8_);
        }
        else {
          auVar9 = vsqrtsd_avx(auVar9,auVar9);
          dVar7 = auVar9._0_8_;
        }
        local_68 = local_68 * dVar7;
        local_50 = cos(local_58);
        local_50 = local_50 * local_68;
        dVar8 = sin(local_58);
        dVar7 = *pdVar5;
        (nucleon._M_current)->x_ = local_50 + (this->super_MinDistNucleus).super_Nucleus.offset_;
        (nucleon._M_current)->y_ = dVar8 * local_68;
        (nucleon._M_current)->z_ = local_60 * dVar7;
        (nucleon._M_current)->is_participant_ = false;
        (nucleon._M_current)->constituents_exist_ = false;
        iVar3 = iVar3 + -1;
      } while ((iVar3 != 0) &&
              (bVar2 = MinDistNucleus::is_too_close(&this->super_MinDistNucleus,nucleon), bVar2));
      nucleon._M_current = nucleon._M_current + 1;
      pdVar5 = pdVar5 + 1;
    } while (nucleon._M_current !=
             (this->super_MinDistNucleus).super_Nucleus.nucleons_.
             super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WoodsSaxonNucleus::sample_nucleons_impl() {
  // When placing nucleons with a minimum distance criterion, resample spherical
  // angles until the nucleon is not too close to a previously sampled nucleon,
  // but do not resample radius -- this could modify the Woods-Saxon dist.

  // Because of the r^2 Jacobian, there is less available space at smaller
  // radii.  Therefore, pre-sample all radii first, sort them, and then place
  // nucleons starting with the smallest radius and working outwards.  This
  // dramatically reduces the chance that a nucleon cannot be placed.
  std::vector<double> radii(size());
  for (auto&& r : radii)
    r = woods_saxon_dist_(random::engine);
  std::sort(radii.begin(), radii.end());

  // Place each nucleon at a pre-sampled radius.
  auto r_iter = radii.cbegin();
  for (iterator nucleon = begin(); nucleon != end(); ++nucleon) {
    // Get radius and advance iterator.
    auto& r = *r_iter++;

    // Sample angles until the minimum distance criterion is satisfied.
    auto ntries = 0;
    do {
      // Sample isotropic spherical angles.
      auto cos_theta = random::cos_theta<double>();
      auto phi = random::phi<double>();

      // Convert to Cartesian coordinates.
      auto r_sin_theta = r * std::sqrt(1. - cos_theta*cos_theta);
      auto x = r_sin_theta * std::cos(phi);
      auto y = r_sin_theta * std::sin(phi);
      auto z = r * cos_theta;

      set_nucleon_position(*nucleon, x, y, z);

      // Retry sampling a reasonable number of times.  If a nucleon cannot be
      // placed, give up and leave it at its last sampled position.  Some
      // approximate numbers for Pb nuclei:
      //
      //   dmin = 0.5 fm, < 0.001% of nucleons cannot be placed
      //          1.0 fm, ~0.005%
      //          1.5 fm, ~0.1%
      //          1.73 fm, ~1%
    } while (++ntries < 1000 && is_too_close(nucleon));
  }
  // XXX: re-center nucleon positions?
}